

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::GL>::Cleanup
          (CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  bool bVar1;
  ContextType type;
  RenderContext *pRVar2;
  CNegativeNoVAOArrays<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  if (bVar1) {
    glu::CallLogWrapper::glDisableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->_program);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_bufferIndirect);
  return 0;
}

Assistant:

virtual long Cleanup()
	{

		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
			glDisableVertexAttribArray(0);

		glUseProgram(0);
		glDeleteProgram(_program);
		glDeleteBuffers(1, &_buffer);
		glDeleteBuffers(1, &_bufferIndirect);
		return NO_ERROR;
	}